

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

bool duckdb::ParquetMultiFileInfo::ParseOption
               (ClientContext *context,string *original_key,Value *val,
               MultiFileOptions *file_options,BaseFileReaderOptions *base_options)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pcVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *__x;
  const_reference column_value;
  _func_int **pp_Var6;
  BinderException *pBVar7;
  size_type __n;
  vector<duckdb::Value,_true> column_values;
  string key;
  bool local_15c;
  vector<duckdb::Value,_true> local_158;
  string local_140;
  MultiFileOptions *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ParquetColumnDefinition local_f8;
  
  local_120 = file_options;
  StringUtil::Lower(&local_140,(string *)original_key);
  if (val->is_null == true) {
    pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
    local_f8._0_8_ = (long)&local_f8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Cannot use NULL as argument to %s","");
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    pcVar1 = (original_key->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar1,pcVar1 + original_key->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar7,(string *)&local_f8,&local_118);
    __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar5 = ::std::__cxx11::string::compare((char *)&local_140);
  local_15c = true;
  if (iVar5 != 0) {
    iVar5 = ::std::__cxx11::string::compare((char *)&local_140);
    if (iVar5 == 0) {
      bVar4 = BooleanValue::Get(val);
      *(bool *)&base_options[1]._vptr_BaseFileReaderOptions = bVar4;
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((char *)&local_140);
      if (iVar5 == 0) {
        bVar4 = BooleanValue::Get(val);
        *(bool *)((long)&base_options[1]._vptr_BaseFileReaderOptions + 1) = bVar4;
      }
      else {
        iVar5 = ::std::__cxx11::string::compare((char *)&local_140);
        if (iVar5 == 0) {
          bVar4 = BooleanValue::Get(val);
          *(bool *)&base_options[4]._vptr_BaseFileReaderOptions = bVar4;
        }
        else {
          iVar5 = ::std::__cxx11::string::compare((char *)&local_140);
          if (iVar5 == 0) {
            ParquetScanFunction::VerifyParquetSchemaParameter(val);
            __x = &ListValue::GetChildren(val)->
                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158,__x);
            if (local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
              local_f8._0_8_ = (long)&local_f8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f8,"Parquet schema cannot be empty","");
              BinderException::BinderException(pBVar7,(string *)&local_f8);
              __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            ::std::
            vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
            ::reserve((vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
                       *)(base_options + 5),
                      (long)local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 6);
            if (local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start) {
              __n = 0;
              do {
                column_value = vector<duckdb::Value,_true>::operator[](&local_158,__n);
                ParquetColumnDefinition::FromSchemaValue(&local_f8,context,column_value);
                ::std::
                vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
                ::emplace_back<duckdb::ParquetColumnDefinition>
                          ((vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
                            *)(base_options + 5),&local_f8);
                Value::~Value(&local_f8.identifier);
                Value::~Value(&local_f8.default_value);
                LogicalType::~LogicalType(&local_f8.type);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.name._M_dataplus._M_p
                    != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&local_f8 + 0x18U)) {
                  operator_delete(local_f8.name._M_dataplus._M_p);
                }
                __n = __n + 1;
              } while (__n < (ulong)((long)local_158.
                                           super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                           .
                                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_158.
                                           super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                           .
                                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 6));
            }
            local_120->auto_detect_hive_partitioning = false;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158);
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)&local_140);
            if (iVar5 == 0) {
              pp_Var6 = (_func_int **)UBigIntValue::Get(val);
              base_options[8]._vptr_BaseFileReaderOptions = pp_Var6;
            }
            else {
              iVar5 = ::std::__cxx11::string::compare((char *)&local_140);
              if (iVar5 == 0) {
                ParquetEncryptionConfig::Create((ParquetEncryptionConfig *)&local_f8,context,val);
                _Var3._M_p = local_f8.name._M_dataplus._M_p;
                uVar2 = local_f8._0_8_;
                local_f8._0_8_ = (_func_int **)0x0;
                local_f8.name._M_dataplus._M_p = (pointer)0x0;
                this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       base_options[3]._vptr_BaseFileReaderOptions;
                base_options[2]._vptr_BaseFileReaderOptions = (_func_int **)uVar2;
                base_options[3]._vptr_BaseFileReaderOptions = (_func_int **)_Var3._M_p;
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.name._M_dataplus._M_p
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_f8.name._M_dataplus._M_p);
                  }
                }
              }
              else {
                local_15c = false;
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  return local_15c;
}

Assistant:

bool ParquetMultiFileInfo::ParseOption(ClientContext &context, const string &original_key, const Value &val,
                                       MultiFileOptions &file_options, BaseFileReaderOptions &base_options) {
	auto &parquet_options = base_options.Cast<ParquetFileReaderOptions>();
	auto &options = parquet_options.options;
	auto key = StringUtil::Lower(original_key);
	if (val.IsNull()) {
		throw BinderException("Cannot use NULL as argument to %s", original_key);
	}
	if (key == "compression") {
		// COMPRESSION has no effect on parquet read.
		// These options are determined from the file.
		return true;
	}
	if (key == "binary_as_string") {
		options.binary_as_string = BooleanValue::Get(val);
		return true;
	}
	if (key == "file_row_number") {
		options.file_row_number = BooleanValue::Get(val);
		return true;
	}
	if (key == "debug_use_openssl") {
		options.debug_use_openssl = BooleanValue::Get(val);
		return true;
	}
	if (key == "schema") {
		// Argument is a map that defines the schema
		const auto &schema_value = val;
		ParquetScanFunction::VerifyParquetSchemaParameter(schema_value);
		const auto column_values = ListValue::GetChildren(schema_value);
		if (column_values.empty()) {
			throw BinderException("Parquet schema cannot be empty");
		}
		options.schema.reserve(column_values.size());
		for (idx_t i = 0; i < column_values.size(); i++) {
			options.schema.emplace_back(ParquetColumnDefinition::FromSchemaValue(context, column_values[i]));
		}
		file_options.auto_detect_hive_partitioning = false;
		return true;
	}
	if (key == "explicit_cardinality") {
		options.explicit_cardinality = UBigIntValue::Get(val);
		return true;
	}
	if (key == "encryption_config") {
		options.encryption_config = ParquetEncryptionConfig::Create(context, val);
		return true;
	}
	return false;
}